

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_adaptive_code.hpp
# Opt level: O1

void __thiscall
LDPC4QKD::RateAdaptiveCode<unsigned_int>::RateAdaptiveCode<unsigned_int>
          (RateAdaptiveCode<unsigned_int> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *colptr,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *rowIdx)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  allocator_type local_21;
  
  puVar4 = (rowIdx->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (rowIdx->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar3 = puVar4 + 1;
  if (puVar3 != puVar1 && puVar4 != puVar1) {
    do {
      puVar2 = puVar3;
      if (*puVar3 <= *puVar4) {
        puVar2 = puVar4;
      }
      puVar4 = puVar2;
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
  }
  this->n_mother_rows = (ulong)(*puVar4 + 1);
  this->n_cols = ((long)(colptr->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(colptr->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 2) - 1;
  compute_mother_pos_varn<unsigned_int>(&this->mother_pos_varn,colptr,rowIdx);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->rows_to_combine,(initializer_list<unsigned_int>)ZEXT816(0),&local_21);
  (this->pos_varn).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pos_varn).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pos_checkn).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pos_varn).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pos_checkn).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pos_checkn).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->n_ra_rows = 0;
  recompute_pos_vn_cn(this,0);
  return;
}

Assistant:

RateAdaptiveCode(const std::vector<colptr_t> &colptr, const std::vector<idx_t> &rowIdx)
                : n_mother_rows(*std::max_element(rowIdx.begin(), rowIdx.end()) + 1u),
                  n_cols(colptr.size() - 1),
                  mother_pos_varn(compute_mother_pos_varn(colptr, rowIdx)), // computed here and henceforth `const`!
                  rows_to_combine({}) {
            constexpr idx_t n_line_combs = 0;
            recompute_pos_vn_cn(n_line_combs);
        }